

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O2

Builder * __thiscall arangodb::velocypack::Builder::operator=(Builder *this,Builder *that)

{
  Buffer<unsigned_char> *pBVar1;
  uchar *puVar2;
  
  if (this == that) {
    return this;
  }
  std::__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::
  operator=((__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *
            )this,(__shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                   *)that);
  pBVar1 = (this->_buffer).
           super___shared_ptr<arangodb::velocypack::Buffer<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (pBVar1 == (Buffer<unsigned_char> *)0x0) {
    pBVar1 = that->_bufferPtr;
    this->_bufferPtr = pBVar1;
    if (pBVar1 == (Buffer<unsigned_char> *)0x0) {
      puVar2 = (uchar *)0x0;
      goto LAB_00105374;
    }
  }
  else {
    this->_bufferPtr = pBVar1;
  }
  puVar2 = pBVar1->_buffer;
LAB_00105374:
  this->_start = puVar2;
  this->_pos = that->_pos;
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::reserve(&this->_stack,4);
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::_M_move_assign(&this->_stack,&that->_stack);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->_indexes,&that->_indexes);
  this->_keyWritten = that->_keyWritten;
  this->options = that->options;
  that->_bufferPtr = (Buffer<unsigned_char> *)0x0;
  clear(that);
  return this;
}

Assistant:

Builder& Builder::operator=(Builder&& that) noexcept {
  if (this != &that) {
    _buffer = std::move(that._buffer);
    if (_buffer != nullptr) {
      _bufferPtr = _buffer.get();
    } else {
      _bufferPtr = that._bufferPtr;
    }
    if (_bufferPtr != nullptr) {
      _start = _bufferPtr->data();
    } else {
      _start = nullptr;
    }
    _pos = that._pos;
    // do a full initial allocation in the arena, so we can maximize its usage
    _stack.reserve(arenaSize / sizeof(decltype(_stack)::value_type));
    _stack = std::move(that._stack);
    _indexes = std::move(that._indexes);
    _keyWritten = that._keyWritten;
    options = that.options;
    VELOCYPACK_ASSERT(that._buffer == nullptr);
    that._bufferPtr = nullptr;
    that.clear();
  }
  return *this;
}